

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

void __thiscall HighsBasis::invalidate(HighsBasis *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 1;
  in_RDI[2] = 0;
  in_RDI[3] = 1;
  *(undefined4 *)(in_RDI + 4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x10),"None");
  return;
}

Assistant:

void HighsBasis::invalidate() {
  this->valid = false;
  this->alien = true;
  this->useful = false;
  this->was_alien = true;
  this->debug_id = -1;
  this->debug_update_count = -1;
  this->debug_origin_name = "None";
}